

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::timestamp_ns_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::NanosecondsOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  long lVar3;
  timestamp_ns_t *result_data_00;
  idx_t iVar4;
  void *dataptr_00;
  ValidityMask *pVVar5;
  SelectionVector *pSVar6;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar7;
  timestamp_ns_t *ldata_3;
  long *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  timestamp_ns_t *ldata_2;
  long *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  timestamp_ns_t *ldata_1;
  long *result_data_1;
  timestamp_ns_t *ldata;
  long *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  ValidityMask *in_stack_fffffffffffffe68;
  timestamp_ns_t in_stack_fffffffffffffe70;
  optional_idx *in_stack_fffffffffffffea0;
  UnifiedVectorFormat *this;
  long *in_stack_fffffffffffffea8;
  timestamp_ns_t *in_stack_fffffffffffffeb0;
  undefined1 uVar9;
  long *plVar8;
  void *in_stack_fffffffffffffeb8;
  ValidityMask *in_stack_fffffffffffffec0;
  ValidityMask *in_stack_fffffffffffffec8;
  idx_t in_stack_fffffffffffffed0;
  Vector *pVVar10;
  long *in_stack_fffffffffffffed8;
  timestamp_ns_t *in_stack_fffffffffffffee0;
  timestamp_ns_t *ldata_00;
  ValidityMask *local_c0 [2];
  ValidityMask local_b0;
  SelectionVector *local_78;
  timestamp_ns_t *local_70;
  long *local_68;
  Vector *local_60;
  optional_idx local_58;
  timestamp_ns_t *local_50;
  timestamp_ns_t *local_48;
  int64_t local_40;
  timestamp_ns_t *local_38;
  long *local_30;
  char local_22;
  byte local_21;
  undefined8 local_18;
  Vector *local_10;
  Vector *local_8;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
    local_48 = (timestamp_ns_t *)FlatVector::GetData<long>((Vector *)0xd00d04);
    result_data_00 = FlatVector::GetData<duckdb::timestamp_ns_t>((Vector *)0xd00d19);
    ldata_00 = local_48;
    local_50 = result_data_00;
    FlatVector::Validity((Vector *)0xd00d5e);
    FlatVector::Validity((Vector *)0xd00d73);
    ExecuteFlat<duckdb::timestamp_ns_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::NanosecondsOperator>>
              (ldata_00,(long *)result_data_00,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)uVar9);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<long>((Vector *)0xd00c46);
    local_38 = ConstantVector::GetData<duckdb::timestamp_ns_t>((Vector *)0xd00c5b);
    bVar2 = ConstantVector::IsNull((Vector *)0xd00c70);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      local_40 = (local_38->super_timestamp_t).value;
      ConstantVector::Validity(local_10);
      lVar3 = GenericUnaryWrapper::
              Operation<duckdb::DatePart::PartOperator<duckdb::DatePart::NanosecondsOperator>,duckdb::timestamp_ns_t,long>
                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
      *local_30 = lVar3;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_58 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar2 = optional_idx::IsValid(&local_58);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex(in_stack_fffffffffffffea0),
         (UnifiedVectorFormat *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0))
      {
        local_60 = DictionaryVector::Child((Vector *)0xd00e1b);
        VVar1 = Vector::GetVectorType(local_60);
        if (VVar1 == FLAT_VECTOR) {
          local_68 = FlatVector::GetData<long>((Vector *)0xd00e45);
          local_70 = FlatVector::GetData<duckdb::timestamp_ns_t>((Vector *)0xd00e5a);
          plVar8 = local_68;
          dataptr_00 = (void *)optional_idx::GetIndex(in_stack_fffffffffffffea0);
          uVar9 = (undefined1)((ulong)plVar8 >> 0x38);
          pVVar5 = FlatVector::Validity((Vector *)0xd00e9b);
          FlatVector::Validity((Vector *)0xd00ead);
          ExecuteFlat<duckdb::timestamp_ns_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::NanosecondsOperator>>
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffec8,pVVar5,dataptr_00,(bool)uVar9);
          local_78 = DictionaryVector::SelVector((Vector *)0xd00eed);
          pVVar10 = local_10;
          pSVar6 = (SelectionVector *)optional_idx::GetIndex(in_stack_fffffffffffffea0);
          duckdb::Vector::Dictionary(local_10,(ulong)pVVar10,pSVar6,(ulong)local_78);
          return;
        }
      }
    }
    this = (UnifiedVectorFormat *)local_c0;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    FlatVector::GetData<long>((Vector *)0xd00f95);
    UnifiedVectorFormat::GetData<duckdb::timestamp_ns_t>((UnifiedVectorFormat *)local_c0);
    pVVar5 = &local_b0;
    pSVar6 = (SelectionVector *)FlatVector::Validity((Vector *)0xd01000);
    uVar7 = local_21 & 1;
    ExecuteLoop<duckdb::timestamp_ns_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::NanosecondsOperator>>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(idx_t)this,pSVar6,pVVar5,
               local_c0[0],in_stack_fffffffffffffec0,(bool)local_18._7_1_);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}